

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetSubpassRenderTargets
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  Uint32 UVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  RenderPassVkImpl *pRVar5;
  RenderPassDesc *Args_1;
  FramebufferVkImpl *pFVar6;
  FramebufferDesc *pFVar7;
  _func_int **pp_Var8;
  Char *pCVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char (*in_RCX) [20];
  ITextureView *local_218;
  undefined1 local_1d8 [8];
  string msg_7;
  undefined1 local_188 [7];
  bool BindRenderTargets;
  string msg_6;
  ShadingRateAttachment *SRAttachmentRef;
  string msg_5;
  string msg_4;
  AttachmentReference *DSAttachmentRef;
  string msg_3;
  string msg_2;
  AttachmentReference *RTAttachmentRef;
  ITextureView *pIStack_c8;
  Uint32 rt;
  ITextureView *pSRM;
  ITextureView *pDSV;
  ITextureView *ppRTVs [8];
  SubpassDesc *Subpass;
  FramebufferDesc *FBDesc;
  RenderPassDesc *RPDesc;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  bVar3 = RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator!(&this->m_pBoundFramebuffer);
  if (bVar3) {
    FormatString<char[26],char[20]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",in_RCX);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [20])0x4ba;
    DebugAssertionFailed
              (pCVar9,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4ba);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar3 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator!(&this->m_pActiveRenderPass);
  if (bVar3) {
    FormatString<char[26],char[20]>
              ((string *)&RPDesc,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass",in_RCX);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4bb);
    std::__cxx11::string::~string((string *)&RPDesc);
  }
  pRVar5 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator->(&this->m_pActiveRenderPass);
  Args_1 = DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                      *)pRVar5);
  pFVar6 = RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator->(&this->m_pBoundFramebuffer);
  pFVar7 = DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                      *)pFVar6);
  pRVar5 = RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator->(&this->m_pActiveRenderPass);
  ppRTVs[7] = (ITextureView *)
              RenderPassBase<Diligent::EngineVkImplTraits>::GetSubpass
                        (&pRVar5->super_RenderPassBase<Diligent::EngineVkImplTraits>,
                         this->m_SubpassIndex);
  this->m_FramebufferSamples = 0;
  memset(&pDSV,0,0x40);
  pSRM = (ITextureView *)0x0;
  pIStack_c8 = (ITextureView *)0x0;
  for (RTAttachmentRef._4_4_ = 0;
      RTAttachmentRef._4_4_ < *(uint *)&ppRTVs[7][2].super_IDeviceObject.super_IObject._vptr_IObject
      ; RTAttachmentRef._4_4_ = RTAttachmentRef._4_4_ + 1) {
    pp_Var8 = ppRTVs[7][3].super_IDeviceObject.super_IObject._vptr_IObject + RTAttachmentRef._4_4_;
    if (*(uint *)pp_Var8 != 0xffffffff) {
      if (Args_1->AttachmentCount <= *(uint *)pp_Var8) {
        FormatString<char[26],char[57]>
                  ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                   (char (*) [57])Args_1);
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"SetSubpassRenderTargets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x4cb);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      ppRTVs[(ulong)RTAttachmentRef._4_4_ - 1] = pFVar7->ppAttachments[*(uint *)pp_Var8];
      if (ppRTVs[(ulong)RTAttachmentRef._4_4_ - 1] != (ITextureView *)0x0) {
        if (this->m_FramebufferSamples == 0) {
          iVar4 = (*(ppRTVs[(ulong)RTAttachmentRef._4_4_ - 1]->super_IDeviceObject).super_IObject.
                    _vptr_IObject[10])();
          lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))();
          this->m_FramebufferSamples = *(Uint32 *)(lVar10 + 0x20);
        }
        else {
          UVar1 = this->m_FramebufferSamples;
          iVar4 = (*(ppRTVs[(ulong)RTAttachmentRef._4_4_ - 1]->super_IDeviceObject).super_IObject.
                    _vptr_IObject[10])();
          lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x20))();
          if (UVar1 != *(Uint32 *)(lVar10 + 0x20)) {
            FormatString<char[26]>
                      ((string *)&DSAttachmentRef,(char (*) [26])"Inconsistent sample count");
            pCVar9 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar9,"SetSubpassRenderTargets",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                       ,0x4d2);
            std::__cxx11::string::~string((string *)&DSAttachmentRef);
          }
        }
      }
    }
  }
  if ((ppRTVs[7][5].super_IDeviceObject.super_IObject._vptr_IObject != (_func_int **)0x0) &&
     (pp_Var8 = ppRTVs[7][5].super_IDeviceObject.super_IObject._vptr_IObject,
     *(uint *)pp_Var8 != 0xffffffff)) {
    if (Args_1->AttachmentCount <= *(uint *)pp_Var8) {
      FormatString<char[26],char[57]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                 (char (*) [57])Args_1);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"SetSubpassRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x4dc);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    if (*(uint *)((long)pp_Var8 + 4) == 0x80) {
      pFVar6 = RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator->(&this->m_pBoundFramebuffer);
      local_218 = FramebufferBase<Diligent::EngineVkImplTraits>::GetReadOnlyDSV
                            (&pFVar6->super_FramebufferBase<Diligent::EngineVkImplTraits>,
                             this->m_SubpassIndex);
    }
    else {
      local_218 = pFVar7->ppAttachments[*(uint *)pp_Var8];
    }
    pSRM = local_218;
    if (local_218 != (ITextureView *)0x0) {
      if (this->m_FramebufferSamples == 0) {
        iVar4 = (*(local_218->super_IDeviceObject).super_IObject._vptr_IObject[10])();
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x20))();
        this->m_FramebufferSamples = *(Uint32 *)(lVar10 + 0x20);
      }
      else {
        UVar1 = this->m_FramebufferSamples;
        iVar4 = (*(local_218->super_IDeviceObject).super_IObject._vptr_IObject[10])();
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x20))();
        if (UVar1 != *(Uint32 *)(lVar10 + 0x20)) {
          FormatString<char[26]>
                    ((string *)&SRAttachmentRef,(char (*) [26])"Inconsistent sample count");
          pCVar9 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar9,"SetSubpassRenderTargets",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                     ,0x4e5);
          std::__cxx11::string::~string((string *)&SRAttachmentRef);
        }
      }
    }
  }
  if ((ppRTVs[7][8].super_IDeviceObject.super_IObject._vptr_IObject != (_func_int **)0x0) &&
     (msg_6.field_2._8_8_ = ppRTVs[7][8].super_IDeviceObject.super_IObject._vptr_IObject,
     *(uint *)msg_6.field_2._8_8_ != 0xffffffff)) {
    if (Args_1->AttachmentCount <= *(uint *)msg_6.field_2._8_8_) {
      FormatString<char[26],char[68]>
                ((string *)local_188,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "SRAttachmentRef.Attachment.AttachmentIndex < RPDesc.AttachmentCount",
                 (char (*) [68])Args_1);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"SetSubpassRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x4ef);
      std::__cxx11::string::~string((string *)local_188);
    }
    pIStack_c8 = pFVar7->ppAttachments[*(uint *)msg_6.field_2._8_8_];
  }
  SetRenderTargetsAttribs::SetRenderTargetsAttribs
            ((SetRenderTargetsAttribs *)((long)&msg_7.field_2 + 8),
             *(Uint32 *)&ppRTVs[7][2].super_IDeviceObject.super_IObject._vptr_IObject,&pDSV,pSRM,
             RESOURCE_STATE_TRANSITION_MODE_NONE,pIStack_c8);
  bVar3 = SetRenderTargets(this,(SetRenderTargetsAttribs *)((long)&msg_7.field_2 + 8));
  this->m_FramebufferWidth = pFVar7->Width;
  this->m_FramebufferHeight = pFVar7->Height;
  uVar2 = pFVar7->NumArraySlices;
  this->m_FramebufferSlices = uVar2;
  if ((this->m_FramebufferSamples == 0) &&
     ((*(int *)&ppRTVs[7][2].super_IDeviceObject.super_IObject._vptr_IObject != 0 ||
      (ppRTVs[7][5].super_IDeviceObject.super_IObject._vptr_IObject != (_func_int **)0x0)))) {
    FormatString<char[26],char[119]>
              ((string *)local_1d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "(m_FramebufferSamples > 0) || (Subpass.RenderTargetAttachmentCount == 0 && Subpass.pDepthStencilAttachment == nullptr)"
               ,(char (*) [119])(ulong)uVar2);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar9,"SetSubpassRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x4fa);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  return bVar3;
}

Assistant:

inline bool DeviceContextBase<ImplementationTraits>::SetSubpassRenderTargets()
{
    VERIFY_EXPR(m_pBoundFramebuffer);
    VERIFY_EXPR(m_pActiveRenderPass);

    const RenderPassDesc&  RPDesc  = m_pActiveRenderPass->GetDesc();
    const FramebufferDesc& FBDesc  = m_pBoundFramebuffer->GetDesc();
    const SubpassDesc&     Subpass = m_pActiveRenderPass->GetSubpass(m_SubpassIndex);

    m_FramebufferSamples = 0;

    ITextureView* ppRTVs[MAX_RENDER_TARGETS] = {};
    ITextureView* pDSV                       = nullptr;
    ITextureView* pSRM                       = nullptr;
    for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
    {
        const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
        if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
            ppRTVs[rt] = FBDesc.ppAttachments[RTAttachmentRef.AttachmentIndex];
            if (ppRTVs[rt] != nullptr)
            {
                if (m_FramebufferSamples == 0)
                    m_FramebufferSamples = ppRTVs[rt]->GetTexture()->GetDesc().SampleCount;
                else
                    DEV_CHECK_ERR(m_FramebufferSamples == ppRTVs[rt]->GetTexture()->GetDesc().SampleCount, "Inconsistent sample count");
            }
        }
    }

    if (Subpass.pDepthStencilAttachment != nullptr)
    {
        const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
        if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
            pDSV = DSAttachmentRef.State == RESOURCE_STATE_DEPTH_READ ?
                m_pBoundFramebuffer->GetReadOnlyDSV(m_SubpassIndex) :
                FBDesc.ppAttachments[DSAttachmentRef.AttachmentIndex];
            if (pDSV != nullptr)
            {
                if (m_FramebufferSamples == 0)
                    m_FramebufferSamples = pDSV->GetTexture()->GetDesc().SampleCount;
                else
                    DEV_CHECK_ERR(m_FramebufferSamples == pDSV->GetTexture()->GetDesc().SampleCount, "Inconsistent sample count");
            }
        }
    }

    if (Subpass.pShadingRateAttachment != nullptr)
    {
        const ShadingRateAttachment& SRAttachmentRef = *Subpass.pShadingRateAttachment;
        if (SRAttachmentRef.Attachment.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            VERIFY_EXPR(SRAttachmentRef.Attachment.AttachmentIndex < RPDesc.AttachmentCount);
            pSRM = FBDesc.ppAttachments[SRAttachmentRef.Attachment.AttachmentIndex];
        }
    }

    bool BindRenderTargets = SetRenderTargets({Subpass.RenderTargetAttachmentCount, ppRTVs, pDSV, RESOURCE_STATE_TRANSITION_MODE_NONE, pSRM});

    // Use framebuffer dimensions (override what was set by SetRenderTargets)
    m_FramebufferWidth  = FBDesc.Width;
    m_FramebufferHeight = FBDesc.Height;
    m_FramebufferSlices = FBDesc.NumArraySlices;
    VERIFY_EXPR((m_FramebufferSamples > 0) || (Subpass.RenderTargetAttachmentCount == 0 && Subpass.pDepthStencilAttachment == nullptr));

    return BindRenderTargets;
}